

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

void free_speech(SPEECH_DATA *speech)

{
  long *in_RDI;
  char *in_stack_fffffffffffffff0;
  
  free_pstring(in_stack_fffffffffffffff0);
  if (in_RDI[1] != 0) {
    if (in_RDI[2] == 0) {
      *(long *)(*in_RDI + 0x30) = in_RDI[1];
    }
    else {
      *(long *)(in_RDI[2] + 8) = in_RDI[1];
      *(long *)(in_RDI[1] + 0x10) = in_RDI[2];
    }
  }
  if (in_RDI != (long *)0x0) {
    operator_delete(in_RDI,0x30);
  }
  return;
}

Assistant:

void free_speech(SPEECH_DATA *speech)
{
	free_pstring(speech->name);

	if (speech->next)
	{
		if (speech->prev)
		{
			speech->prev->next = speech->next;
			speech->next->prev = speech->prev;
		}
		else
		{
			speech->mob->speech = speech->next;
		}
	}

	delete speech;
}